

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::~CommandLine(CommandLine<Catch::ConfigData> *this)

{
  Arg *__ptr;
  IArgFunction<Catch::ConfigData> *pIVar1;
  
  __ptr = (this->m_floatingArg)._M_t.
          super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
          _M_head_impl;
  if (__ptr != (Arg *)0x0) {
    std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::operator()
              ((default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg> *)
               &this->m_floatingArg,__ptr);
  }
  (this->m_floatingArg)._M_t.
  super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>._M_head_impl =
       (Arg *)0x0;
  std::
  _Rb_tree<int,_std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,_std::_Select1st<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::~_Rb_tree(&(this->m_positionalArgs)._M_t);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::~vector(&this->m_options);
  pIVar1 = (this->m_boundProcessName).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
    return;
  }
  return;
}

Assistant:

Arg() {}